

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  size_t sVar5;
  void *__buf;
  void *__buf_00;
  double dVar6;
  bool local_32a;
  allocator local_2c9;
  string local_2c8 [32];
  double local_2a8;
  double duration;
  string local_298 [32];
  double local_278;
  double bars;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  undefined1 local_220 [8];
  MidiFile midifile;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [55];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  options.m_extraArgv_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  smf::Options::Options((Options *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"b|bars|m|measures=d:1.0",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,
             "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)",
             &local_159);
  smf::Options::define((Options *)local_100,(string *)local_120,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"d|duration|t|tempo=d:1.0",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a8,"Stretch duration of track(s) by factor specified",
             (allocator *)&midifile.field_0x6f);
  smf::Options::define((Options *)local_100,(string *)local_180,(string *)local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&midifile.field_0x6f);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  sVar5 = 1;
  smf::Options::process
            ((Options *)local_100,argc,
             (char **)options.m_extraArgv_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,1,0);
  iVar2 = smf::Options::getArgCount((Options *)local_100);
  if (iVar2 != 2) {
    std::operator<<((ostream *)&std::cerr,"two MIDI filenames are required.\n");
    exit(1);
  }
  smf::MidiFile::MidiFile((MidiFile *)local_220);
  psVar3 = smf::Options::getArg_abi_cxx11_((Options *)local_100,1);
  smf::MidiFile::read((MidiFile *)local_220,(int)psVar3,__buf,sVar5);
  bVar1 = smf::MidiFile::status((MidiFile *)local_220);
  if (bVar1) {
    std::allocator<char>::allocator();
    bars._6_1_ = 0;
    bars._5_1_ = 0;
    std::__cxx11::string::string(local_240,"bars",&local_241);
    bVar1 = smf::Options::getBoolean((Options *)local_100,(string *)local_240);
    sVar5 = CONCAT71((int7)(sVar5 >> 8),bVar1);
    local_32a = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      bars._6_1_ = 1;
      std::__cxx11::string::string(local_268,"duration",(allocator *)((long)&bars + 7));
      bars._5_1_ = 1;
      local_32a = smf::Options::getBoolean((Options *)local_100,(string *)local_268);
    }
    if ((bars._5_1_ & 1) != 0) {
      std::__cxx11::string::~string(local_268);
    }
    if ((bars._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&bars + 7));
    }
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    if (local_32a != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_298,"bars",(allocator *)((long)&duration + 7));
      dVar6 = smf::Options::getDouble((Options *)local_100,(string *)local_298);
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator((allocator<char> *)((long)&duration + 7));
      local_278 = dVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"duration",&local_2c9);
      dVar6 = smf::Options::getDouble((Options *)local_100,(string *)local_2c8);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      local_2a8 = dVar6;
      if ((((local_278 < 0.1) || (10.0 < local_278)) || (dVar6 < 0.1)) || (10.0 < dVar6)) {
        std::operator<<((ostream *)&std::cerr,"stretch parameters must be between 0.1 and 10.\n");
        exit(1);
      }
      doStretch((MidiFile *)local_220,local_278,dVar6);
    }
    psVar3 = smf::Options::getArg_abi_cxx11_((Options *)local_100,2);
    smf::MidiFile::write((MidiFile *)local_220,(int)psVar3,__buf_00,sVar5);
    smf::MidiFile::~MidiFile((MidiFile *)local_220);
    smf::Options::~Options((Options *)local_100);
    return 0;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Error reading MIDI file ");
  psVar3 = smf::Options::getArg_abi_cxx11_((Options *)local_100,1);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
   Options options;
   options.define("b|bars|m|measures=d:1.0", 
      "Stretch width of bars (measures) by factor specified (WITHOUT affecting tempo)");
   options.define("d|duration|t|tempo=d:1.0",
      "Stretch duration of track(s) by factor specified");
   options.process(argc, argv);
   if (options.getArgCount() != 2) {
      cerr << "two MIDI filenames are required.\n";
      exit(1);
   }

   MidiFile midifile;
   midifile.read(options.getArg(1));
   if (!midifile.status()) {
      cerr << "Error reading MIDI file " << options.getArg(1) << endl;
      exit(1);
   }

   if (options.getBoolean("bars") || options.getBoolean("duration")) {
      double bars = options.getDouble("bars");
      double duration = options.getDouble("duration");
      if (bars < 0.1 || bars > 10.0 || duration < 0.1 || duration > 10.0) {
	  cerr << "stretch parameters must be between 0.1 and 10.\n";
	  exit(1);
      }
      doStretch(midifile, bars, duration);
   }

   midifile.write(options.getArg(2));
   return 0;
}